

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model_parameters.cc
# Opt level: O0

bool __thiscall xLearn::Model::Deserialize(Model *this,string *filename)

{
  byte bVar1;
  bool bVar2;
  ostream *poVar3;
  ostream *poVar4;
  FILE *pFVar5;
  FILE *in_stack_00000010;
  FILE *file;
  string *in_stack_000000a8;
  FILE *in_stack_000000b0;
  char *in_stack_000000c8;
  char *in_stack_000000d0;
  size_t in_stack_00000178;
  char *in_stack_00000180;
  FILE *in_stack_00000188;
  FILE *in_stack_fffffffffffffef8;
  Model *in_stack_ffffffffffffff00;
  string *in_stack_ffffffffffffff78;
  int in_stack_ffffffffffffff84;
  string *in_stack_ffffffffffffff88;
  LogSeverity in_stack_ffffffffffffff94;
  allocator local_41;
  string local_40 [36];
  Logger local_1c [7];
  
  bVar1 = std::__cxx11::string::empty();
  if ((bVar1 & 1) != 1) {
    std::__cxx11::string::c_str();
    pFVar5 = OpenFileOrDie(in_stack_000000d0,in_stack_000000c8);
    if (pFVar5 != (FILE *)0x0) {
      ReadStringFromFile(in_stack_000000b0,in_stack_000000a8);
      ReadStringFromFile(in_stack_000000b0,in_stack_000000a8);
      ReadDataFromDisk(in_stack_00000188,in_stack_00000180,in_stack_00000178);
      ReadDataFromDisk(in_stack_00000188,in_stack_00000180,in_stack_00000178);
      ReadDataFromDisk(in_stack_00000188,in_stack_00000180,in_stack_00000178);
      ReadDataFromDisk(in_stack_00000188,in_stack_00000180,in_stack_00000178);
      deserialize_w_v_b(in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
      Close(in_stack_00000010);
    }
    return pFVar5 != (FILE *)0x0;
  }
  Logger::Logger(local_1c,ERR);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_40,
             "/workspace/llm4binary/github/license_all_cmakelists_25/etveritas[P]xlearn/src/data/model_parameters.cc"
             ,&local_41);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&stack0xffffffffffffff88,"Deserialize",(allocator *)&stack0xffffffffffffff87)
  ;
  poVar3 = Logger::Start(in_stack_ffffffffffffff94,in_stack_ffffffffffffff88,
                         in_stack_ffffffffffffff84,in_stack_ffffffffffffff78);
  poVar3 = std::operator<<(poVar3,"CHECK_NE failed ");
  poVar3 = std::operator<<(poVar3,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/etveritas[P]xlearn/src/data/model_parameters.cc"
                          );
  poVar3 = std::operator<<(poVar3,":");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,300);
  poVar3 = std::operator<<(poVar3,"\n");
  poVar3 = std::operator<<(poVar3,"filename.empty()");
  poVar3 = std::operator<<(poVar3," = ");
  bVar2 = (bool)std::__cxx11::string::empty();
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,bVar2);
  poVar3 = std::operator<<(poVar3,"\n");
  poVar4 = std::operator<<(poVar3,"true");
  poVar4 = std::operator<<(poVar4," = ");
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,true);
  std::operator<<(poVar4,"\n");
  std::__cxx11::string::~string((string *)&stack0xffffffffffffff88);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff87);
  std::__cxx11::string::~string(local_40);
  std::allocator<char>::~allocator((allocator<char> *)&local_41);
  Logger::~Logger((Logger *)poVar3);
  abort();
}

Assistant:

bool Model::Deserialize(const std::string& filename) {
  CHECK_NE(filename.empty(), true);
#ifndef _MSC_VER
  FILE* file = OpenFileOrDie(filename.c_str(), "r");
#else
  FILE* file = OpenFileOrDie(filename.c_str(), "rb");
#endif
  if (file == NULL) { return false; }
  // Read score function
  ReadStringFromFile(file, score_func_);
  // Read loss function
  ReadStringFromFile(file, loss_func_);
  // Read feature num
  ReadDataFromDisk(file, (char*)&num_feat_, sizeof(num_feat_));
  // Read field num
  ReadDataFromDisk(file, (char*)&num_field_, sizeof(num_field_));
  // Read K
  ReadDataFromDisk(file, (char*)&num_K_, sizeof(num_K_));
  // Read aux_size
  ReadDataFromDisk(file, (char*)&aux_size_, sizeof(aux_size_));
  // Read w
  this->deserialize_w_v_b(file);
  Close(file);
  return true;
}